

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_types.cpp
# Opt level: O2

void duckdb_parquet::swap(SizeStatistics *a,SizeStatistics *b)

{
  _SizeStatistics__isset _Var1;
  int64_t iVar2;
  
  iVar2 = a->unencoded_byte_array_data_bytes;
  a->unencoded_byte_array_data_bytes = b->unencoded_byte_array_data_bytes;
  b->unencoded_byte_array_data_bytes = iVar2;
  std::swap<duckdb::vector<long,true>>
            (&a->repetition_level_histogram,&b->repetition_level_histogram);
  std::swap<duckdb::vector<long,true>>
            (&a->definition_level_histogram,&b->definition_level_histogram);
  _Var1 = a->__isset;
  a->__isset = b->__isset;
  b->__isset = _Var1;
  return;
}

Assistant:

void swap(SizeStatistics &a, SizeStatistics &b) {
  using ::std::swap;
  swap(a.unencoded_byte_array_data_bytes, b.unencoded_byte_array_data_bytes);
  swap(a.repetition_level_histogram, b.repetition_level_histogram);
  swap(a.definition_level_histogram, b.definition_level_histogram);
  swap(a.__isset, b.__isset);
}